

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

void __thiscall
SslTcpServerImpl::SetAlpnProtokollNames
          (SslTcpServerImpl *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vStrProtoNames)

{
  bool bVar1;
  reference this_00;
  SslServerContext *ctx;
  iterator __end1;
  iterator __begin1;
  vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
  *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vStrProtoNames_local;
  SslTcpServerImpl *this_local;
  
  __end1 = std::
           vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
           ::begin(&this->m_SslCtx);
  ctx = (SslServerContext *)
        std::
        vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
        ::end(&this->m_SslCtx);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<OpenSSLWrapper::SslServerContext_*,_std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>_>
                                *)&ctx);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<OpenSSLWrapper::SslServerContext_*,_std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>_>
              ::operator*(&__end1);
    OpenSSLWrapper::SslServerContext::SetAlpnProtokollNames(this_00,vStrProtoNames);
    __gnu_cxx::
    __normal_iterator<OpenSSLWrapper::SslServerContext_*,_std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void SslTcpServerImpl::SetAlpnProtokollNames(const vector<string>& vStrProtoNames)
{
    for (auto& ctx : m_SslCtx)
        ctx.SetAlpnProtokollNames(vStrProtoNames);
}